

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O2

bool __thiscall
CStorage::FindFile(CStorage *this,char *pFilename,char *pPath,int Type,char *pBuffer,int BufferSize,
                  SHA256_DIGEST *pWantedSha256,uint WantedCrc,uint WantedSize)

{
  bool bVar1;
  long in_FS_OFFSET;
  CFindCBData local_50;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.m_pWantedSha256 = pWantedSha256;
  local_50.m_WantedCrc = WantedCrc;
  local_50.m_WantedSize = WantedSize;
  local_50.m_CheckHashAndSize = true;
  local_50.m_pStorage = this;
  local_50.m_pFilename = pFilename;
  local_50.m_pPath = pPath;
  local_50.m_pBuffer = pBuffer;
  local_50.m_BufferSize = BufferSize;
  bVar1 = FindFileImpl(this,Type,&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

virtual bool FindFile(const char *pFilename, const char *pPath, int Type, char *pBuffer, int BufferSize, const SHA256_DIGEST *pWantedSha256, unsigned WantedCrc, unsigned WantedSize)
	{
		CFindCBData Data;
		Data.m_pStorage = this;
		Data.m_pFilename = pFilename;
		Data.m_pPath = pPath;
		Data.m_pBuffer = pBuffer;
		Data.m_BufferSize = BufferSize;
		Data.m_pWantedSha256 = pWantedSha256;
		Data.m_WantedCrc = WantedCrc;
		Data.m_WantedSize = WantedSize;
		Data.m_CheckHashAndSize = true;
		return FindFileImpl(Type, &Data);
	}